

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationIdentifier.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SimulationIdentifier *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Site:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16SiteID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Application: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16ApplicationID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString SimulationIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "Site:        " << m_ui16SiteID           << "\n"
       << "Application: " << m_ui16ApplicationID    << "\n";

    return ss.str();
}